

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O0

EdwardsPoint * ecc_edwards_multiply(EdwardsPoint *B,mp_int *n)

{
  uint swap;
  EdwardsPoint *orig;
  EdwardsPoint *Q;
  EdwardsPoint *P;
  EdwardsPoint *other;
  EdwardsPoint *sum;
  size_t sStack_40;
  uint nbit;
  size_t bitindex;
  EdwardsPoint *pEStack_30;
  uint not_started_yet;
  EdwardsPoint *kplus1_B;
  EdwardsPoint *k_B;
  EdwardsPoint *two_B;
  mp_int *n_local;
  EdwardsPoint *B_local;
  
  orig = ecc_edwards_add(B,B);
  kplus1_B = ecc_edwards_point_copy(B);
  pEStack_30 = ecc_edwards_point_copy(orig);
  bitindex._4_4_ = 1;
  sStack_40 = mp_max_bits(n);
  while (sStack_40 != 0) {
    swap = mp_get_bit(n,sStack_40 - 1);
    Q = ecc_edwards_add(kplus1_B,pEStack_30);
    ecc_edwards_cond_swap(kplus1_B,pEStack_30,swap);
    P = ecc_edwards_add(kplus1_B,kplus1_B);
    ecc_edwards_point_free(kplus1_B);
    ecc_edwards_point_free(pEStack_30);
    ecc_edwards_cond_swap(P,Q,swap);
    ecc_edwards_cond_overwrite(P,B,bitindex._4_4_);
    ecc_edwards_cond_overwrite(Q,orig,bitindex._4_4_);
    bitindex._4_4_ = (swap ^ 0xffffffff) & bitindex._4_4_;
    sStack_40 = sStack_40 - 1;
    pEStack_30 = Q;
    kplus1_B = P;
  }
  ecc_edwards_point_free(orig);
  ecc_edwards_point_free(pEStack_30);
  return kplus1_B;
}

Assistant:

EdwardsPoint *ecc_edwards_multiply(EdwardsPoint *B, mp_int *n)
{
    EdwardsPoint *two_B = ecc_edwards_add(B, B);
    EdwardsPoint *k_B = ecc_edwards_point_copy(B);
    EdwardsPoint *kplus1_B = ecc_edwards_point_copy(two_B);

    /*
     * Another copy of the same exponentiation routine following the
     * pattern of the Montgomery ladder, because it works as well as
     * any other technique and this way I didn't have to debug two of
     * them.
     */

    unsigned not_started_yet = 1;
    for (size_t bitindex = mp_max_bits(n); bitindex-- > 0 ;) {
        unsigned nbit = mp_get_bit(n, bitindex);

        EdwardsPoint *sum = ecc_edwards_add(k_B, kplus1_B);
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);
        EdwardsPoint *other = ecc_edwards_add(k_B, k_B);
        ecc_edwards_point_free(k_B);
        ecc_edwards_point_free(kplus1_B);
        k_B = other;
        kplus1_B = sum;
        ecc_edwards_cond_swap(k_B, kplus1_B, nbit);

        ecc_edwards_cond_overwrite(k_B, B, not_started_yet);
        ecc_edwards_cond_overwrite(kplus1_B, two_B, not_started_yet);
        not_started_yet &= ~nbit;
    }

    ecc_edwards_point_free(two_B);
    ecc_edwards_point_free(kplus1_B);
    return k_B;
}